

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

FT_Error sfnt_table_info(TT_Face face,FT_UInt idx,FT_ULong *tag,FT_ULong *offset,FT_ULong *length)

{
  FT_ULong *length_local;
  FT_ULong *offset_local;
  FT_ULong *tag_local;
  FT_UInt idx_local;
  TT_Face face_local;
  
  if ((offset == (FT_ULong *)0x0) || (length == (FT_ULong *)0x0)) {
    face_local._4_4_ = 6;
  }
  else {
    if (tag == (FT_ULong *)0x0) {
      *length = (ulong)face->num_tables;
    }
    else {
      if (face->num_tables <= idx) {
        return 0x8e;
      }
      *tag = face->dir_tables[idx].Tag;
      *offset = face->dir_tables[idx].Offset;
      *length = face->dir_tables[idx].Length;
    }
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

static FT_Error
  sfnt_table_info( TT_Face    face,
                   FT_UInt    idx,
                   FT_ULong  *tag,
                   FT_ULong  *offset,
                   FT_ULong  *length )
  {
    if ( !offset || !length )
      return FT_THROW( Invalid_Argument );

    if ( !tag )
      *length = face->num_tables;
    else
    {
      if ( idx >= face->num_tables )
        return FT_THROW( Table_Missing );

      *tag    = face->dir_tables[idx].Tag;
      *offset = face->dir_tables[idx].Offset;
      *length = face->dir_tables[idx].Length;
    }

    return FT_Err_Ok;
  }